

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  Data *pDVar1;
  ulong uVar2;
  pointer pcVar3;
  uint uVar4;
  LevelMode LVar5;
  LevelRoundingMode LVar6;
  int iVar7;
  Format FVar8;
  LineOrder *pLVar9;
  TileDescription *pTVar10;
  Box2i *pBVar11;
  Compression *pCVar12;
  Compressor *pCVar13;
  TileBuffer *pTVar14;
  pointer pcVar15;
  ulong uVar16;
  TileOffsets local_70;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_48;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&Imf_2_5::DEEPTILE_abi_cxx11_);
  pLVar9 = Header::lineOrder(&this->_data->header);
  pDVar1 = this->_data;
  pDVar1->lineOrder = *pLVar9;
  pTVar10 = Header::tileDescription(&pDVar1->header);
  pDVar1 = this->_data;
  uVar4 = pTVar10->ySize;
  LVar5 = pTVar10->mode;
  LVar6 = pTVar10->roundingMode;
  (pDVar1->tileDesc).xSize = pTVar10->xSize;
  (pDVar1->tileDesc).ySize = uVar4;
  (pDVar1->tileDesc).mode = LVar5;
  (pDVar1->tileDesc).roundingMode = LVar6;
  pBVar11 = Header::dataWindow(&this->_data->header);
  iVar7 = (pBVar11->min).x;
  pDVar1 = this->_data;
  pDVar1->minX = iVar7;
  maxX = (pBVar11->max).x;
  pDVar1->maxX = maxX;
  minY = (pBVar11->min).y;
  pDVar1->minY = minY;
  maxY = (pBVar11->max).y;
  pDVar1->maxY = maxY;
  precalculateTileInfo
            (&pDVar1->tileDesc,iVar7,maxX,minY,maxY,&pDVar1->numXTiles,&pDVar1->numYTiles,
             &pDVar1->numXLevels,&pDVar1->numYLevels);
  pDVar1 = this->_data;
  if (pDVar1->lineOrder == INCREASING_Y) {
    iVar7 = 0;
  }
  else {
    iVar7 = *pDVar1->numYTiles + -1;
  }
  (pDVar1->nextTileToWrite).dx = 0;
  (pDVar1->nextTileToWrite).dy = iVar7;
  (pDVar1->nextTileToWrite).lx = 0;
  (pDVar1->nextTileToWrite).ly = 0;
  pCVar12 = Header::compression(&pDVar1->header);
  pCVar13 = newTileCompressor(*pCVar12,0,(ulong)(this->_data->tileDesc).ySize,&this->_data->header);
  FVar8 = defaultFormat(pCVar13);
  this->_data->format = FVar8;
  if (pCVar13 != (Compressor *)0x0) {
    (*pCVar13->_vptr_Compressor[1])(pCVar13);
  }
  pDVar1 = this->_data;
  TileOffsets::TileOffsets
            (&local_70,(pDVar1->tileDesc).mode,pDVar1->numXLevels,pDVar1->numYLevels,
             pDVar1->numXTiles,pDVar1->numYTiles);
  pDVar1 = this->_data;
  (pDVar1->tileOffsets)._numYLevels = local_70._numYLevels;
  (pDVar1->tileOffsets)._mode = local_70._mode;
  (pDVar1->tileOffsets)._numXLevels = local_70._numXLevels;
  local_48.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pDVar1->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pDVar1->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pDVar1->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pDVar1->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_70._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pDVar1->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_70._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pDVar1->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_70._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_70._offsets);
  pDVar1 = this->_data;
  iVar7 = getChunkOffsetTableSize(&pDVar1->header,false);
  Header::setChunkCount(&pDVar1->header,iVar7);
  pDVar1 = this->_data;
  pDVar1->maxSampleCountTableSize =
       (ulong)((pDVar1->tileDesc).xSize * (pDVar1->tileDesc).ySize) << 2;
  if ((this->_data->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_data->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 0;
    do {
      pTVar14 = (TileBuffer *)operator_new(0xb8);
      pTVar14->uncompressedData = (char *)0x0;
      pTVar14->buffer = (char *)0x0;
      *(undefined8 *)&pTVar14->dataSize = 0;
      pTVar14->compressor = (Compressor *)0x0;
      pTVar14->dy = 0;
      pTVar14->lx = 0;
      pTVar14->ly = 0;
      pTVar14->hasException = false;
      *(undefined3 *)&pTVar14->field_0x35 = 0;
      (pTVar14->exception)._M_dataplus._M_p = (pointer)0x0;
      (pTVar14->exception)._M_string_length = 0;
      *(undefined8 *)((long)&(pTVar14->exception).field_2 + 8) = 0;
      *(undefined8 *)&pTVar14->_sem = 0;
      *(undefined8 *)&pTVar14->field_0x59 = 0;
      *(undefined8 *)&pTVar14->field_0x61 = 0;
      *(TileBuffer **)&pTVar14->field_0x70 = pTVar14 + 1;
      *(undefined8 *)&pTVar14->field_0x78 = 0;
      *(undefined1 *)&pTVar14[1].uncompressedData = 0;
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&pTVar14[1].dataSize,1);
      (this->_data->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar16] = pTVar14;
      uVar2 = this->_data->maxSampleCountTableSize;
      pTVar14 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16];
      pcVar15 = (pointer)operator_new__(uVar2);
      pcVar3 = (pTVar14->exception)._M_dataplus._M_p;
      if (pcVar3 != (pointer)0x0) {
        operator_delete__(pcVar3);
      }
      pTVar14->ly = (int)uVar2;
      pTVar14->hasException = (bool)(char)(uVar2 >> 0x20);
      *(int3 *)&pTVar14->field_0x35 = (int3)(uVar2 >> 0x28);
      (pTVar14->exception)._M_dataplus._M_p = pcVar15;
      memset(((this->_data->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16]->exception)._M_dataplus._M_p,0,
             this->_data->maxSampleCountTableSize);
      pCVar12 = Header::compression(&this->_data->header);
      pCVar13 = newCompressor(*pCVar12,this->_data->maxSampleCountTableSize,&this->_data->header);
      *(Compressor **)
       ((long)&((this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16]->exception).field_2 + 8) = pCVar13
      ;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)(this->_data->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_data->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header &header)
{
    _data->header = header;
    _data->header.setType(DEEPTILE);
    _data->lineOrder = _data->header.lineOrder();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription();

    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
                          _data->minX, _data->maxX,
                          _data->minY, _data->maxY,
                          _data->numXTiles, _data->numYTiles,
                          _data->numXLevels, _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)?
                               TileCoord (0, 0, 0, 0):
                               TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor
                                (_data->header.compression(),
                                 0,
                                 _data->tileDesc.ySize,
                                 _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0)
        delete compressor;

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
                                      _data->numXLevels,
                                      _data->numYLevels,
                                      _data->numXTiles,
                                      _data->numYTiles);
                                      
    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount(getChunkOffsetTableSize(_data->header));
                                      
    _data->maxSampleCountTableSize = _data->tileDesc.ySize *
                                     _data->tileDesc.xSize *
                                     sizeof(int);

                                     
    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.
                resizeErase(_data->maxSampleCountTableSize);

        char * p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor =
                newCompressor (_data->header.compression(),
                               _data->maxSampleCountTableSize,
                               _data->header);
    }
}